

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::advance_past_deleted
          (sparse_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *psVar4;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar5;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar6;
  int *piVar7;
  size_type sVar8;
  bool bVar9;
  bool bVar10;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar11;
  sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *psVar12;
  int *piVar13;
  
  psVar4 = this->ht;
  psVar5 = (this->pos).row_end._M_current;
  psVar6 = (this->end).row_current._M_current;
  piVar7 = (this->end).col_current;
  psVar12 = (this->pos).row_current._M_current;
  piVar13 = (this->pos).col_current;
  bVar9 = (this->end).row_end._M_current != psVar5;
  bVar10 = (this->pos).row_begin._M_current != (this->end).row_begin._M_current;
  if (((bVar9 || bVar10) || (psVar12 != psVar6)) || (psVar6 != psVar5 && piVar13 != piVar7)) {
    sVar8 = psVar4->num_deleted;
    do {
      if (sVar8 == 0) {
        return;
      }
      iVar2 = (psVar4->key_info).delkey;
      iVar3 = *piVar13;
      piVar1 = &(psVar4->key_info).super_TransparentHasher.super_Hasher.num_compares_;
      *piVar1 = *piVar1 + 1;
      if (iVar3 + iVar2 != 0) {
        return;
      }
      piVar13 = piVar13 + 1;
      (this->pos).col_current = piVar13;
      if (piVar13 == psVar12->group + (psVar12->settings).num_buckets) {
        psVar12 = psVar12 + 1;
        if (psVar12 != psVar5) {
          do {
            psVar11 = psVar12;
            psVar12 = psVar11;
            if ((psVar11->settings).num_buckets != 0) break;
            psVar12 = psVar11 + 1;
          } while (psVar12 != psVar5);
          piVar13 = psVar11->group;
          (this->pos).col_current = piVar13;
        }
        (this->pos).row_current._M_current = psVar12;
      }
    } while ((psVar12 != psVar6 || (bVar9 || bVar10)) || (psVar6 != psVar5 && piVar13 != piVar7));
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }